

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void copy2buff(StkId top,int n,char *buff)

{
  long lVar1;
  size_t local_40;
  size_t l;
  TString *st;
  size_t tl;
  char *buff_local;
  int n_local;
  StkId top_local;
  
  st = (TString *)0x0;
  buff_local._4_4_ = n;
  do {
    lVar1 = *(long *)(top + -(long)buff_local._4_4_);
    if (*(char *)(lVar1 + 0xb) == -1) {
      local_40 = *(size_t *)(lVar1 + 0x10);
    }
    else {
      local_40 = (size_t)*(byte *)(lVar1 + 0xb);
    }
    memcpy(buff + (long)st,(void *)(lVar1 + 0x18),local_40);
    st = (TString *)(st->contents + (local_40 - 0x18));
    buff_local._4_4_ = buff_local._4_4_ + -1;
  } while (0 < buff_local._4_4_);
  return;
}

Assistant:

static void copy2buff (StkId top, int n, char *buff) {
  size_t tl = 0;  /* size already copied */
  do {
    TString *st = tsvalue(s2v(top - n));
    size_t l = tsslen(st);  /* length of string being copied */
    memcpy(buff + tl, getstr(st), l * sizeof(char));
    tl += l;
  } while (--n > 0);
}